

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_CopyFrom_Test::TestBody
          (ExtensionSetTest_CopyFrom_Test *this)

{
  undefined1 local_70 [8];
  TestAllExtensions message2;
  TestAllExtensions message1;
  ExtensionSetTest_CopyFrom_Test *this_local;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_70);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::CopyFrom
            ((TestAllExtensions *)local_70,
             (TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)local_70);
  proto2_unittest::TestAllExtensions::CopyFrom
            ((TestAllExtensions *)local_70,
             (TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)local_70);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_70);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(ExtensionSetTest, CopyFrom) {
  unittest::TestAllExtensions message1, message2;

  TestUtil::SetAllExtensions(&message1);
  message2.CopyFrom(message1);
  TestUtil::ExpectAllExtensionsSet(message2);
  message2.CopyFrom(message1);  // exercise copy when fields already exist
  TestUtil::ExpectAllExtensionsSet(message2);
}